

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O1

bool __thiscall
cmCTestStartCommand::InitialPass
          (cmCTestStartCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  ulong uVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  char *__s;
  ulong uVar8;
  pointer pbVar9;
  string startLogFile;
  string sourceDir;
  string binaryDir;
  cmGeneratedFileStream ofs;
  ostringstream cmCTestLog_msg_3;
  pointer local_4a8;
  string *local_4a0;
  pointer local_498;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  undefined1 local_410 [32];
  byte abStack_3f0 [80];
  ios_base local_3a0 [504];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_410._0_8_ = local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_410,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,(string *)local_410);
LAB_002b3e26:
    if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
LAB_002b3e33:
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    return false;
  }
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar9) {
    local_4a8 = (pointer)0x0;
    local_4a0 = (string *)0x0;
    local_498 = (char *)0x0;
  }
  else {
    local_498 = (pointer)0x0;
    uVar8 = 0;
    local_4a0 = (string *)0x0;
    local_4a8 = (pointer)0x0;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(pbVar9 + uVar8));
      if ((iVar5 == 0) ||
         (iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar8)),
         iVar5 == 0)) {
        uVar1 = uVar8 + 1;
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (((ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5) <= uVar1
            ) || ((iVar5 = std::__cxx11::string::compare((char *)(pbVar9 + uVar1)), iVar5 == 0 ||
                  (iVar5 = std::__cxx11::string::compare
                                     ((char *)((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + uVar1)),
                  iVar5 == 0)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_410,pbVar9[uVar8]._M_dataplus._M_p,
                              pbVar9[uVar8]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," argument missing group name",0x1c);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError((cmCommand *)this,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
          std::ios_base::~ios_base(local_3a0);
          return false;
        }
        cmCTest::SetSpecificGroup
                  ((this->super_cmCTestCommand).CTest,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_dataplus._M_p);
        uVar8 = uVar8 + 2;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar8));
        if (iVar5 == 0) {
          uVar8 = uVar8 + 1;
          this->CreateNewTag = false;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar8));
          if (iVar5 == 0) {
            uVar8 = uVar8 + 1;
            this->Quiet = true;
          }
          else if (local_498 == (pointer)0x0) {
            local_498 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            uVar8 = uVar8 + 1;
          }
          else if (local_4a0 == (string *)0x0) {
            local_4a0 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar8;
            uVar8 = uVar8 + 1;
          }
          else {
            if (local_4a8 != (pointer)0x0) {
              local_410._0_8_ = local_410 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_410,"Too many arguments","");
              cmCommand::SetError((cmCommand *)this,(string *)local_410);
              if ((undefined1 *)local_410._0_8_ == local_410 + 0x10) {
                return false;
              }
              goto LAB_002b3e33;
            }
            local_4a8 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar8;
            uVar8 = uVar8 + 1;
          }
        }
      }
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5))
    ;
  }
  if (local_4a0 == (string *)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_410._0_8_ = local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CTEST_SOURCE_DIRECTORY","")
    ;
    local_4a0 = (string *)cmMakefile::GetDefinition(pcVar2,(string *)local_410);
    if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
  }
  if (local_4a8 == (pointer)0x0) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    local_410._0_8_ = local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CTEST_BINARY_DIRECTORY","")
    ;
    local_4a8 = (pointer)cmMakefile::GetDefinition(pcVar2,(string *)local_410);
    if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
  }
  if (local_4a0 == (string *)0x0) {
    local_410._0_8_ = local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_410,
               "source directory not specified. Specify source directory as an argument or set CTEST_SOURCE_DIRECTORY"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_410);
    goto LAB_002b3e26;
  }
  if (local_4a8 == (string *)0x0) {
    local_410._0_8_ = local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_410,
               "binary directory not specified. Specify binary directory as an argument or set CTEST_BINARY_DIRECTORY"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_410);
    goto LAB_002b3e26;
  }
  if ((local_498 == (char *)0x0) && (this->CreateNewTag == true)) {
    local_410._0_8_ = local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_410,
               "no test model specified and APPEND not specified. Specify either a test model or the APPEND argument"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_410);
    goto LAB_002b3e26;
  }
  cmsys::SystemTools::AddKeepPath(local_4a0);
  cmsys::SystemTools::AddKeepPath(local_4a8);
  cmCTest::EmptyCTestConfiguration((this->super_cmCTestCommand).CTest);
  cmsys::SystemTools::CollapseFullPath(&local_450,local_4a0);
  cmsys::SystemTools::CollapseFullPath(&local_430,local_4a8);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"SourceDirectory",&local_450,this->Quiet);
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestCommand).CTest,"BuildDirectory",&local_430,this->Quiet);
  if (local_498 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_410,"Run dashboard with to-be-determined model",0x29);
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)local_410);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Source directory: ",0x15);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(local_4a0->_M_dataplus)._M_p,local_4a0->_M_string_length);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Build directory: ",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(local_4a8->_M_dataplus)._M_p,local_4a8->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x74,(char *)local_1a8._0_8_,this->Quiet);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_410,"Run dashboard with model ",0x19);
    sVar6 = strlen(local_498);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,local_498,sVar6);
    std::ios::widen((char)(ostream *)local_410 + (char)*(undefined8 *)(local_410._0_8_ + -0x18));
    std::ostream::put((char)local_410);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Source directory: ",0x15);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(local_4a0->_M_dataplus)._M_p,local_4a0->_M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   Build directory: ",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(local_4a8->_M_dataplus)._M_p,local_4a8->_M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x6c,(char *)local_1a8._0_8_,this->Quiet);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
  std::ios_base::~ios_base(local_3a0);
  __s = cmCTest::GetSpecificGroup((this->super_cmCTestCommand).CTest);
  if (__s != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,"   Group: ",10);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,__s,sVar6);
    std::ios::widen((char)(ostream *)local_410 + (char)*(undefined8 *)(local_410._0_8_ + -0x18));
    std::ostream::put((char)local_410);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x79,(char *)local_1a8._0_8_,this->Quiet);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    std::ios_base::~ios_base(local_3a0);
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,local_430._M_dataplus._M_p,
             local_430._M_dataplus._M_p + local_430._M_string_length);
  std::__cxx11::string::append((char *)&local_470);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_410,&local_470,false,None);
  if ((abStack_3f0[*(long *)(local_410._0_8_ + -0x18)] & 5) == 0) {
    bVar4 = InitialCheckout(this,(ostream *)local_410,&local_450);
    if (bVar4) {
      bVar4 = cmsys::SystemTools::FileIsDirectory(&local_450);
      if (bVar4) {
        cmCTest::SetRunCurrentScript((this->super_cmCTestCommand).CTest,false);
        cmCTest::SetSuppressUpdatingCTestConfiguration((this->super_cmCTestCommand).CTest,true);
        if (local_498 == (char *)0x0) {
          iVar5 = -1;
        }
        else {
          local_1a8._0_8_ = local_1a8 + 0x10;
          sVar6 = strlen(local_498);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,local_498,local_498 + sVar6);
          iVar5 = cmCTest::GetTestModelFromString((string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        cmCTest::SetTestModel((this->super_cmCTestCommand).CTest,iVar5);
        cmCTest::SetProduceXML((this->super_cmCTestCommand).CTest,true);
        bVar4 = cmCTest::InitializeFromCommand((this->super_cmCTestCommand).CTest,this);
        goto LAB_002b423c;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"given source path\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_450._M_dataplus._M_p,local_450._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"which is not an existing directory.  ",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"Set CTEST_CHECKOUT_COMMAND to a command line to create it.",0x3a);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_490);
      goto LAB_002b4149;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot create log file: LastStart.log",0x25);
    std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
    pcVar3 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                 ,0x81,local_490._M_dataplus._M_p,false);
LAB_002b4149:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar4 = false;
LAB_002b423c:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool cmCTestStartCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  size_t cnt = 0;
  const char* smodel = nullptr;
  cmValue src_dir;
  cmValue bld_dir;

  while (cnt < args.size()) {
    if (args[cnt] == "GROUP" || args[cnt] == "TRACK") {
      cnt++;
      if (cnt >= args.size() || args[cnt] == "APPEND" ||
          args[cnt] == "QUIET") {
        std::ostringstream e;
        e << args[cnt - 1] << " argument missing group name";
        this->SetError(e.str());
        return false;
      }
      this->CTest->SetSpecificGroup(args[cnt].c_str());
      cnt++;
    } else if (args[cnt] == "APPEND") {
      cnt++;
      this->CreateNewTag = false;
    } else if (args[cnt] == "QUIET") {
      cnt++;
      this->Quiet = true;
    } else if (!smodel) {
      smodel = args[cnt].c_str();
      cnt++;
    } else if (!src_dir) {
      src_dir = cmValue(args[cnt]);
      cnt++;
    } else if (!bld_dir) {
      bld_dir = cmValue(args[cnt]);
      cnt++;
    } else {
      this->SetError("Too many arguments");
      return false;
    }
  }

  if (!src_dir) {
    src_dir = this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY");
  }
  if (!bld_dir) {
    bld_dir = this->Makefile->GetDefinition("CTEST_BINARY_DIRECTORY");
  }
  if (!src_dir) {
    this->SetError("source directory not specified. Specify source directory "
                   "as an argument or set CTEST_SOURCE_DIRECTORY");
    return false;
  }
  if (!bld_dir) {
    this->SetError("binary directory not specified. Specify binary directory "
                   "as an argument or set CTEST_BINARY_DIRECTORY");
    return false;
  }
  if (!smodel && this->CreateNewTag) {
    this->SetError("no test model specified and APPEND not specified. Specify "
                   "either a test model or the APPEND argument");
    return false;
  }

  cmSystemTools::AddKeepPath(*src_dir);
  cmSystemTools::AddKeepPath(*bld_dir);

  this->CTest->EmptyCTestConfiguration();

  std::string sourceDir = cmSystemTools::CollapseFullPath(*src_dir);
  std::string binaryDir = cmSystemTools::CollapseFullPath(*bld_dir);
  this->CTest->SetCTestConfiguration("SourceDirectory", sourceDir,
                                     this->Quiet);
  this->CTest->SetCTestConfiguration("BuildDirectory", binaryDir, this->Quiet);

  if (smodel) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with model "
                         << smodel << std::endl
                         << "   Source directory: " << *src_dir << std::endl
                         << "   Build directory: " << *bld_dir << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with "
                       "to-be-determined model"
                         << std::endl
                         << "   Source directory: " << *src_dir << std::endl
                         << "   Build directory: " << *bld_dir << std::endl,
                       this->Quiet);
  }
  const char* group = this->CTest->GetSpecificGroup();
  if (group) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Group: " << group << std::endl, this->Quiet);
  }

  // Log startup actions.
  std::string startLogFile = binaryDir + "/Testing/Temporary/LastStart.log";
  cmGeneratedFileStream ofs(startLogFile);
  if (!ofs) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: LastStart.log" << std::endl);
    return false;
  }

  // Make sure the source directory exists.
  if (!this->InitialCheckout(ofs, sourceDir)) {
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDir)) {
    std::ostringstream e;
    e << "given source path\n"
      << "  " << sourceDir << "\n"
      << "which is not an existing directory.  "
      << "Set CTEST_CHECKOUT_COMMAND to a command line to create it.";
    this->SetError(e.str());
    return false;
  }

  this->CTest->SetRunCurrentScript(false);
  this->CTest->SetSuppressUpdatingCTestConfiguration(true);
  int model;
  if (smodel) {
    model = cmCTest::GetTestModelFromString(smodel);
  } else {
    model = cmCTest::UNKNOWN;
  }
  this->CTest->SetTestModel(model);
  this->CTest->SetProduceXML(true);

  return this->CTest->InitializeFromCommand(this);
}